

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5SnippetScore(Fts5ExtensionApi *pApi,Fts5Context *pFts,int nDocsize,uchar *aSeen,int iCol,
                    int iPos,int nToken,int *pnScore,int *piPos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  int nInst;
  int iOff;
  int ic;
  int ip;
  int local_84;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = -0x55555556;
  iVar2 = (*pApi->xInstCount)(pFts,&local_48);
  if (iVar2 == 0 && 0 < local_48) {
    iVar4 = -1;
    local_84 = 0;
    iVar8 = 1;
    iVar5 = 0;
    do {
      iVar2 = (*pApi->xInst)(pFts,iVar8 + -1,&local_3c,&local_40,&local_44);
      iVar1 = local_44;
      if ((((iVar2 == 0) && (local_40 == iCol)) && (iPos <= local_44)) &&
         ((long)local_44 < (long)iPos + (long)nToken)) {
        iVar3 = iVar5 + 1;
        iVar5 = iVar5 + 1000;
        if (aSeen[local_3c] != '\0') {
          iVar5 = iVar3;
        }
        aSeen[local_3c] = '\x01';
        if (iVar4 < 0) {
          iVar4 = local_44;
        }
        local_84 = (*pApi->xPhraseSize)(pFts,local_3c);
        local_84 = local_84 + iVar1;
      }
    } while ((iVar8 < local_48) && (iVar8 = iVar8 + 1, iVar2 == 0));
  }
  else {
    iVar5 = 0;
    iVar4 = -1;
    local_84 = 0;
  }
  *pnScore = iVar5;
  if (piPos != (int *)0x0) {
    lVar6 = (long)(iVar4 - ((iVar4 + nToken) - local_84) / 2);
    lVar7 = (long)(nDocsize - nToken);
    if (nToken + lVar6 <= (long)nDocsize) {
      lVar7 = lVar6;
    }
    iVar5 = 0;
    if (0 < lVar7) {
      iVar5 = (int)lVar7;
    }
    *piPos = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts5SnippetScore(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  int nDocsize,                   /* Size of column in tokens */
  unsigned char *aSeen,           /* Array with one element per query phrase */
  int iCol,                       /* Column to score */
  int iPos,                       /* Starting offset to score */
  int nToken,                     /* Max tokens per snippet */
  int *pnScore,                   /* OUT: Score */
  int *piPos                      /* OUT: Adjusted offset */
){
  int rc;
  int i;
  int ip = 0;
  int ic = 0;
  int iOff = 0;
  int iFirst = -1;
  int nInst;
  int nScore = 0;
  int iLast = 0;
  sqlite3_int64 iEnd = (sqlite3_int64)iPos + nToken;

  rc = pApi->xInstCount(pFts, &nInst);
  for(i=0; i<nInst && rc==SQLITE_OK; i++){
    rc = pApi->xInst(pFts, i, &ip, &ic, &iOff);
    if( rc==SQLITE_OK && ic==iCol && iOff>=iPos && iOff<iEnd ){
      nScore += (aSeen[ip] ? 1 : 1000);
      aSeen[ip] = 1;
      if( iFirst<0 ) iFirst = iOff;
      iLast = iOff + pApi->xPhraseSize(pFts, ip);
    }
  }

  *pnScore = nScore;
  if( piPos ){
    sqlite3_int64 iAdj = iFirst - (nToken - (iLast-iFirst)) / 2;
    if( (iAdj+nToken)>nDocsize ) iAdj = nDocsize - nToken;
    if( iAdj<0 ) iAdj = 0;
    *piPos = (int)iAdj;
  }

  return rc;
}